

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

SPIRVariable * __thiscall
diligent_spirv_cross::Compiler::maybe_get_backing_variable(Compiler *this,uint32_t chain)

{
  SPIRVariable *pSVar1;
  SPIRExpression *pSVar2;
  SPIRAccessChain *pSVar3;
  
  pSVar1 = maybe_get<diligent_spirv_cross::SPIRVariable>(this,chain);
  if (pSVar1 == (SPIRVariable *)0x0) {
    pSVar2 = maybe_get<diligent_spirv_cross::SPIRExpression>(this,chain);
    if (pSVar2 == (SPIRExpression *)0x0) {
      pSVar1 = (SPIRVariable *)0x0;
    }
    else {
      pSVar1 = maybe_get<diligent_spirv_cross::SPIRVariable>(this,(pSVar2->loaded_from).id);
    }
    pSVar3 = maybe_get<diligent_spirv_cross::SPIRAccessChain>(this,chain);
    if (pSVar3 != (SPIRAccessChain *)0x0) {
      pSVar1 = maybe_get<diligent_spirv_cross::SPIRVariable>(this,*(uint32_t *)(pSVar3 + 0x5c));
      return pSVar1;
    }
  }
  return pSVar1;
}

Assistant:

SPIRVariable *Compiler::maybe_get_backing_variable(uint32_t chain)
{
	auto *var = maybe_get<SPIRVariable>(chain);
	if (!var)
	{
		auto *cexpr = maybe_get<SPIRExpression>(chain);
		if (cexpr)
			var = maybe_get<SPIRVariable>(cexpr->loaded_from);

		auto *access_chain = maybe_get<SPIRAccessChain>(chain);
		if (access_chain)
			var = maybe_get<SPIRVariable>(access_chain->loaded_from);
	}

	return var;
}